

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

IVec3 __thiscall
deqp::gles31::Functional::anon_unknown_1::LayeredRenderCase::getTargetDimensions
          (LayeredRenderCase *this,LayeredRenderTargetType target)

{
  undefined4 uVar1;
  int iVar2;
  undefined4 uVar3;
  IVec3 IVar4;
  
  iVar2 = 0;
  uVar1 = 0;
  uVar3 = 0;
  if (target < TARGET_LAST) {
    uVar1 = *(undefined4 *)(&DAT_01887c58 + (ulong)target * 4);
    uVar3 = *(undefined4 *)(&DAT_01887c6c + (ulong)target * 4);
    iVar2 = 0x40;
  }
  *(int *)&(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode = iVar2;
  *(undefined4 *)((long)&(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode + 4) =
       uVar1;
  *(undefined4 *)&(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx = uVar3;
  IVar4.m_data[2] = iVar2;
  IVar4.m_data._0_8_ = this;
  return (IVec3)IVar4.m_data;
}

Assistant:

tcu::IVec3 LayeredRenderCase::getTargetDimensions (LayeredRenderTargetType target)
{
	switch (target)
	{
		case TARGET_CUBE:			return tcu::IVec3(64, 64, 0);
		case TARGET_3D:				return tcu::IVec3(64, 64, 4);
		case TARGET_1D_ARRAY:		return tcu::IVec3(64, 4, 0);
		case TARGET_2D_ARRAY:		return tcu::IVec3(64, 64, 4);
		case TARGET_2D_MS_ARRAY:	return tcu::IVec3(64, 64, 2);
		default:
			DE_ASSERT(DE_FALSE);
			return tcu::IVec3(0, 0, 0);
	}
}